

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

bool __thiscall
vkb::PhysicalDevice::is_features_node_present(PhysicalDevice *this,GenericFeaturesPNextNode *node)

{
  bool bVar1;
  undefined1 local_30 [8];
  GenericFeatureChain requested_features;
  GenericFeaturesPNextNode *node_local;
  PhysicalDevice *this_local;
  
  requested_features.nodes.
  super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = node;
  detail::GenericFeatureChain::GenericFeatureChain((GenericFeatureChain *)local_30);
  std::
  vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ::push_back((vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
               *)local_30,
              requested_features.nodes.
              super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar1 = detail::GenericFeatureChain::find_and_match
                    (&this->extended_features_chain,(GenericFeatureChain *)local_30);
  detail::GenericFeatureChain::~GenericFeatureChain((GenericFeatureChain *)local_30);
  return bVar1;
}

Assistant:

bool PhysicalDevice::is_features_node_present(detail::GenericFeaturesPNextNode const& node) const {
    detail::GenericFeatureChain requested_features;
    requested_features.nodes.push_back(node);

    return extended_features_chain.find_and_match(requested_features);
}